

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost2001_paramgen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int iVar1;
  int *piVar2;
  EC_KEY *key;
  EVP_PKEY *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  EC_KEY *ec;
  gost_pmeth_data *data;
  int in_stack_00000034;
  EC_KEY *in_stack_00000038;
  
  piVar2 = (int *)EVP_PKEY_CTX_get_data(in_RDI);
  if ((piVar2 == (int *)0x0) || (*piVar2 == 0)) {
    ERR_GOST_error((int)((ulong)piVar2 >> 0x20),(int)piVar2,(char *)0x0,0);
  }
  else {
    key = EC_KEY_new();
    iVar1 = fill_GOST_EC_params(in_stack_00000038,in_stack_00000034);
    if ((iVar1 != 0) && (iVar1 = EVP_PKEY_assign(in_RSI,0x32b,key), iVar1 != 0)) {
      return 1;
    }
    EC_KEY_free(key);
  }
  return 0;
}

Assistant:

static int pkey_gost2001_paramgen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey)
{
    struct gost_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);
    EC_KEY *ec = NULL;

    if (!data || data->sign_param_nid == NID_undef) {
        GOSTerr(GOST_F_PKEY_GOST2001_PARAMGEN, GOST_R_NO_PARAMETERS_SET);
        return 0;
    }

    ec = EC_KEY_new();
    if (!fill_GOST_EC_params(ec, data->sign_param_nid)
        || !EVP_PKEY_assign(pkey, NID_id_GostR3410_2001, ec)) {
        EC_KEY_free(ec);
        return 0;
    }
    return 1;
}